

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx.cpp
# Opt level: O0

int __thiscall ncnn::Deconvolution_x86_avx::create_pipeline(Deconvolution_x86_avx *this,Option *opt)

{
  int *piVar1;
  long lVar2;
  ulong uVar3;
  Layer *pLVar4;
  undefined8 *puVar5;
  byte *in_RSI;
  long *in_RDI;
  float *k00_1;
  int j;
  int i_2;
  int k_2;
  int p_2;
  float *g00_1;
  int q_1;
  Mat weight_data_r2_1;
  int k_1;
  int i_1;
  float *p_1;
  float *pt;
  Mat weight_data_transposed;
  Mat weights [1];
  float *k00;
  int i;
  int k;
  int q;
  float *g00;
  int p;
  Mat weight_data_r2;
  Mat tmp;
  ParamDict pd;
  int maxk_1;
  int out_elempack;
  int elempack;
  int num_input;
  int maxk;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  ParamDict *in_stack_fffffffffffff710;
  Allocator *in_stack_fffffffffffff718;
  undefined4 in_stack_fffffffffffff720;
  int in_stack_fffffffffffff724;
  int in_stack_fffffffffffff728;
  int in_stack_fffffffffffff72c;
  Mat *in_stack_fffffffffffff730;
  int _c;
  Allocator *pAVar6;
  undefined8 in_stack_fffffffffffff738;
  void **ppvVar7;
  Mat *in_stack_fffffffffffff740;
  Option *in_stack_fffffffffffff7c0;
  Mat *in_stack_fffffffffffff7c8;
  int in_stack_fffffffffffff7d4;
  Allocator *in_stack_fffffffffffff800;
  undefined8 in_stack_fffffffffffff808;
  int _c_00;
  long *plVar8;
  undefined8 in_stack_fffffffffffff810;
  Mat *in_stack_fffffffffffff818;
  void **ppvVar9;
  void **local_7c8;
  int local_778;
  int local_774;
  undefined8 local_768;
  undefined8 local_760;
  undefined4 local_740;
  undefined4 local_734;
  undefined8 local_728;
  void *local_720;
  int local_718;
  int local_714;
  int local_710;
  int local_70c;
  undefined8 local_708;
  undefined8 local_700;
  undefined8 local_6f8;
  undefined4 local_6f0;
  long local_6e8;
  undefined4 local_6e0;
  undefined4 local_6dc;
  undefined4 local_6d8;
  undefined4 local_6d4;
  undefined4 local_6d0;
  undefined8 local_6c8;
  undefined4 *local_6c0;
  int local_6b4;
  void *local_6b0;
  int *local_6a8;
  long local_6a0;
  long *local_690;
  int local_684;
  int local_680;
  long local_670;
  int local_668;
  int local_664;
  long local_660;
  _func_int **local_658;
  Allocator local_650;
  int *local_648;
  undefined8 local_640;
  undefined4 local_638;
  long *local_630;
  undefined4 local_628;
  undefined4 local_624;
  undefined4 local_620;
  undefined4 local_61c;
  undefined4 local_618;
  undefined8 local_610;
  undefined1 local_608 [16];
  void *local_5f8;
  int *local_5f0;
  long *local_5d8;
  void *local_5b0;
  undefined8 local_5a8;
  undefined8 local_5a0;
  undefined4 local_598;
  undefined4 local_588;
  undefined4 local_584;
  undefined4 local_580;
  undefined4 local_57c;
  undefined4 local_578;
  undefined8 local_570;
  void *local_568;
  int local_55c;
  int local_558;
  int local_554;
  undefined4 *local_550;
  int local_544;
  void *local_540;
  int *local_538;
  long local_530;
  undefined4 local_528;
  long *local_520;
  undefined4 local_518;
  int local_514;
  int local_510;
  undefined4 local_50c;
  undefined4 local_508;
  long local_500;
  void *local_4f8;
  int *local_4f0;
  long local_4e8;
  undefined4 local_4e0;
  long *local_4d8;
  undefined4 local_4d0;
  int local_4cc;
  undefined4 local_4c8;
  undefined4 local_4c4;
  undefined4 local_4c0;
  undefined8 local_4b8;
  ParamDict local_4a0;
  int local_48c;
  int local_488;
  int local_484;
  int local_480;
  int local_47c;
  byte *local_478;
  void **local_468;
  void **local_460;
  int local_454;
  undefined8 *local_450;
  int local_444;
  void **local_440;
  int local_434;
  void **local_430;
  undefined1 local_425;
  int local_424;
  void **local_420;
  undefined8 *local_418;
  undefined1 local_40d;
  int local_40c;
  long *local_408;
  undefined8 *local_400;
  undefined1 local_3f5;
  int local_3f4;
  void **local_3f0;
  void **local_3e8;
  void **local_3c8;
  void **local_3b8;
  void **local_3a0;
  void **local_390;
  undefined8 *local_380;
  undefined8 *local_370;
  void **local_360;
  Allocator *local_350;
  int local_340;
  undefined4 local_33c;
  void **local_338;
  void **local_330;
  void **local_328;
  undefined8 local_320;
  undefined8 local_318;
  undefined4 local_30c;
  Allocator *local_308;
  undefined8 *local_300;
  Allocator *local_2f8;
  long *local_2f0;
  int local_2e8;
  undefined4 local_2e4;
  void **local_2e0;
  int local_2c8;
  undefined4 local_2c4;
  Allocator *local_2c0;
  int local_2a8;
  undefined4 local_2a4;
  void **local_2a0;
  undefined8 *local_280;
  undefined8 *local_260;
  int local_248;
  undefined4 local_244;
  void **local_240;
  int local_228;
  undefined4 local_224;
  void **local_220;
  int local_1f8;
  undefined4 local_1f4;
  void **local_1f0;
  void **local_1d0;
  int local_198;
  undefined4 local_194;
  undefined8 *local_190;
  void *local_170;
  void **local_158;
  long local_150;
  undefined4 local_144;
  long local_140;
  undefined4 *local_138;
  undefined4 local_12c;
  int local_128;
  int local_124;
  undefined8 *local_120;
  void *local_100;
  undefined8 *local_e8;
  undefined4 local_dc;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined4 local_bc;
  long local_b8;
  void *local_b0;
  void *local_68;
  void *local_58;
  _func_int **local_18;
  
  _c_00 = (int)((ulong)in_stack_fffffffffffff808 >> 0x20);
  local_478 = in_RSI;
  pLVar4 = create_activation_layer
                     (in_stack_fffffffffffff7d4,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0)
  ;
  in_RDI[1] = (long)pLVar4;
  local_47c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
  uVar3 = (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x110) / (long)local_47c;
  local_480 = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                   (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
  local_484 = 1;
  local_488 = 1;
  if ((local_478[0x27] & 1) != 0) {
    if (local_480 % 8 == 0) {
      local_774 = 8;
    }
    else {
      local_774 = 1;
      if (local_480 % 4 == 0) {
        local_774 = 4;
      }
    }
    local_484 = local_774;
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 8 == 0) {
      local_778 = 8;
    }
    else {
      local_778 = 1;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0) {
        local_778 = 4;
      }
    }
    local_488 = local_778;
  }
  if ((local_478[0x1d] & 1) == 0) {
    local_30c = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x18c);
    pAVar6 = &local_650;
    local_318 = 4;
    local_320 = 0;
    local_650._vptr_Allocator = (_func_int **)0x0;
    local_648 = (int *)0x0;
    local_640 = 0;
    local_638 = 0;
    local_630 = (long *)0x0;
    local_628 = 0;
    local_624 = 0;
    local_620 = 0;
    local_61c = 0;
    local_618 = 0;
    local_610 = 0;
    local_308 = pAVar6;
    Mat::create(in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
                CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                in_stack_fffffffffffff718);
    _c = (int)((ulong)in_stack_fffffffffffff730 >> 0x20);
    local_2f8 = &local_650;
    local_658 = local_650._vptr_Allocator;
    local_2f0 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x160);
    local_660 = *local_2f0;
    for (local_664 = 0;
        local_664 < local_480 * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_664 = local_664 + 1) {
      for (local_668 = 0; local_668 < local_47c; local_668 = local_668 + 1) {
        *(undefined4 *)((long)local_658 + (long)((local_47c + -1) - local_668) * 4) =
             *(undefined4 *)(local_660 + (long)local_668 * 4);
      }
      local_660 = local_660 + (long)local_47c * 4;
      local_658 = (_func_int **)((long)local_658 + (long)local_47c * 4);
    }
    Mat::reshape(in_stack_fffffffffffff818,(int)((ulong)in_stack_fffffffffffff810 >> 0x20),
                 (int)in_stack_fffffffffffff810,_c_00,in_stack_fffffffffffff800);
    Mat::create(in_stack_fffffffffffff740,(int)((ulong)in_stack_fffffffffffff738 >> 0x20),
                (int)in_stack_fffffffffffff738,_c,
                CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                in_stack_fffffffffffff724,pAVar6);
    for (local_6b4 = 0;
        local_6b4 + local_488 + -1 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_6b4 = local_488 + local_6b4) {
      local_408 = in_RDI + 3;
      local_40c = local_6b4 / local_488;
      local_400 = &local_708;
      local_124 = *(int *)((long)in_RDI + 0x44);
      local_128 = (int)in_RDI[9];
      local_12c = *(undefined4 *)((long)in_RDI + 0x4c);
      local_138 = (undefined4 *)(*local_408 + in_RDI[0xb] * (long)local_40c * in_RDI[5]);
      local_140 = in_RDI[5];
      local_144 = (undefined4)in_RDI[6];
      local_150 = in_RDI[7];
      local_120 = &local_708;
      local_c8 = (long)local_124 * (long)local_128 * local_140;
      local_300 = &local_708;
      local_380 = &local_708;
      local_cc = 0x10;
      local_40d = 1;
      local_708 = 0;
      local_6f8 = 0;
      local_6f0 = 0;
      local_6e0 = 0;
      local_6dc = 0;
      local_6d8 = 0;
      local_6d4 = 0;
      local_6d0 = 0;
      local_6c8 = 0;
      local_700 = 0;
      local_6c0 = local_138;
      for (local_70c = 0; local_70c + local_484 + -1 < local_480; local_70c = local_484 + local_70c)
      {
        for (local_710 = 0; local_710 < local_47c; local_710 = local_710 + 1) {
          for (local_714 = 0; local_714 < local_484; local_714 = local_714 + 1) {
            for (local_718 = 0; local_718 < local_488; local_718 = local_718 + 1) {
              local_424 = local_6b4 + local_718;
              local_418 = &local_768;
              local_420 = &local_6b0;
              local_100 = (void *)((long)local_6b0 + local_670 * local_424 * local_6a0);
              local_e8 = &local_768;
              local_d8 = (long)local_684 * (long)local_680 * local_6a0;
              local_454 = local_70c + local_714;
              local_450 = &local_768;
              local_720 = (void *)((long)local_100 + (long)local_684 * (long)local_454 * local_6a0);
              local_370 = &local_768;
              local_dc = 0x10;
              local_425 = 1;
              local_768 = 0;
              local_740 = 0;
              local_734 = 0;
              local_728 = 0;
              local_760 = 0;
              *local_6c0 = *(undefined4 *)((long)local_720 + (long)local_710 * 4);
              local_6c0 = local_6c0 + 1;
              local_280 = local_370;
            }
          }
        }
      }
      local_260 = local_380;
      local_6e8 = local_150;
    }
    ppvVar7 = &local_6b0;
    local_360 = ppvVar7;
    local_2a0 = ppvVar7;
    if (local_6a8 != (int *)0x0) {
      local_2a4 = 0xffffffff;
      LOCK();
      local_2a8 = *local_6a8;
      *local_6a8 = *local_6a8 + -1;
      UNLOCK();
      if (local_2a8 == 1) {
        if (local_690 == (long *)0x0) {
          if (local_6b0 != (void *)0x0) {
            free(local_6b0);
          }
        }
        else {
          (**(code **)(*local_690 + 0x18))(local_690,local_6b0);
        }
      }
    }
    *ppvVar7 = (void *)0x0;
    ppvVar7[2] = (void *)0x0;
    *(undefined4 *)(ppvVar7 + 3) = 0;
    *(undefined4 *)(ppvVar7 + 5) = 0;
    *(undefined4 *)((long)ppvVar7 + 0x2c) = 0;
    *(undefined4 *)(ppvVar7 + 6) = 0;
    *(undefined4 *)((long)ppvVar7 + 0x34) = 0;
    *(undefined4 *)(ppvVar7 + 7) = 0;
    ppvVar7[8] = (void *)0x0;
    ppvVar7[1] = (void *)0x0;
    pAVar6 = &local_650;
    local_350 = pAVar6;
    local_2c0 = pAVar6;
    if (local_648 != (int *)0x0) {
      local_2c4 = 0xffffffff;
      LOCK();
      local_2c8 = *local_648;
      *local_648 = *local_648 + -1;
      UNLOCK();
      if (local_2c8 == 1) {
        if (local_630 == (long *)0x0) {
          local_18 = local_650._vptr_Allocator;
          if (local_650._vptr_Allocator != (_func_int **)0x0) {
            free(local_650._vptr_Allocator);
          }
        }
        else {
          (**(code **)(*local_630 + 0x18))(local_630,local_650._vptr_Allocator);
        }
      }
    }
    pAVar6->_vptr_Allocator = (_func_int **)0x0;
    pAVar6[2]._vptr_Allocator = (_func_int **)0x0;
    *(undefined4 *)&pAVar6[3]._vptr_Allocator = 0;
    *(undefined4 *)&pAVar6[5]._vptr_Allocator = 0;
    *(undefined4 *)((long)&pAVar6[5]._vptr_Allocator + 4) = 0;
    *(undefined4 *)&pAVar6[6]._vptr_Allocator = 0;
    *(undefined4 *)((long)&pAVar6[6]._vptr_Allocator + 4) = 0;
    *(undefined4 *)&pAVar6[7]._vptr_Allocator = 0;
    pAVar6[8]._vptr_Allocator = (_func_int **)0x0;
    pAVar6[1]._vptr_Allocator = (_func_int **)0x0;
  }
  else {
    local_48c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
                *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
    pLVar4 = create_layer((int)((ulong)in_stack_fffffffffffff718 >> 0x20));
    in_RDI[2] = (long)pLVar4;
    ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff730);
    ParamDict::set(&local_4a0,2,1);
    ParamDict::set(&local_4a0,3,0);
    ParamDict::set(&local_4a0,4,1);
    ParamDict::set(&local_4a0,5,0);
    ParamDict::set(&local_4a0,6,1);
    ParamDict::set(&local_4a0,7,
                   local_48c * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
    ParamDict::set(&local_4a0,8,0);
    ParamDict::set(&local_4a0,9,local_480);
    ParamDict::set(&local_4a0,10,-1);
    ParamDict::set(&local_4a0,0xb,0);
    ParamDict::set(&local_4a0,0xc,local_488);
    (**(code **)(*(long *)in_RDI[2] + 0x10))((long *)in_RDI[2],&local_4a0);
    local_468 = &local_4f8;
    local_4f8 = (void *)0x0;
    local_4f0 = (int *)0x0;
    local_4e8 = 0;
    local_4e0 = 0;
    local_4d8 = (long *)0x0;
    local_4d0 = 0;
    local_4cc = 0;
    local_4c8 = 0;
    local_4c4 = 0;
    local_4c0 = 0;
    local_4b8 = 0;
    Mat::reshape(in_stack_fffffffffffff818,(int)((ulong)in_stack_fffffffffffff810 >> 0x20),
                 (int)in_stack_fffffffffffff810,_c_00,in_stack_fffffffffffff800);
    Mat::create(in_stack_fffffffffffff730,in_stack_fffffffffffff72c,in_stack_fffffffffffff728,
                CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                in_stack_fffffffffffff718);
    for (local_544 = 0; local_544 < local_480; local_544 = local_544 + 1) {
      local_430 = &local_4f8;
      local_434 = local_544;
      local_550 = (undefined4 *)((long)local_4f8 + (long)local_4cc * (long)local_544 * local_4e8);
      for (local_554 = 0;
          local_554 + local_488 + -1 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
          local_554 = local_488 + local_554) {
        for (local_558 = 0; local_558 < local_48c; local_558 = local_558 + 1) {
          for (local_55c = 0; local_55c < local_488; local_55c = local_55c + 1) {
            local_3f4 = local_554 + local_55c;
            local_3e8 = &local_5b0;
            local_3f0 = &local_540;
            local_170 = (void *)((long)local_540 + local_500 * local_3f4 * local_530);
            local_158 = &local_5b0;
            local_b8 = (long)local_514 * (long)local_510 * local_530;
            local_bc = 0x10;
            local_3f5 = 1;
            local_440 = &local_5b0;
            local_444 = local_544;
            local_568 = (void *)((long)local_170 + (long)local_514 * (long)local_544 * local_530);
            local_3c8 = &local_5b0;
            local_5b0 = (void *)0x0;
            local_5a0 = 0;
            local_598 = 0;
            local_588 = 0;
            local_584 = 0;
            local_580 = 0;
            local_57c = 0;
            local_578 = 0;
            local_570 = 0;
            local_5a8 = 0;
            *local_550 = *(undefined4 *)((long)local_568 + (long)local_558 * 4);
            local_550 = local_550 + 1;
            local_1d0 = local_3c8;
          }
        }
      }
    }
    local_3b8 = &local_540;
    local_1f0 = local_3b8;
    if (local_538 != (int *)0x0) {
      local_1f4 = 0xffffffff;
      LOCK();
      local_1f8 = *local_538;
      *local_538 = *local_538 + -1;
      UNLOCK();
      if (local_1f8 == 1) {
        if (local_520 == (long *)0x0) {
          if (local_540 != (void *)0x0) {
            free(local_540);
          }
        }
        else {
          (**(code **)(*local_520 + 0x18))(local_520,local_540);
        }
      }
    }
    local_540 = (void *)0x0;
    local_530 = 0;
    local_528 = 0;
    local_518 = 0;
    local_514 = 0;
    local_510 = 0;
    local_50c = 0;
    local_508 = 0;
    local_500 = 0;
    local_538 = (int *)0x0;
    local_7c8 = &local_5f8;
    do {
      local_460 = local_7c8;
      *local_7c8 = (void *)0x0;
      local_7c8[1] = (void *)0x0;
      local_7c8[2] = (void *)0x0;
      *(undefined4 *)(local_7c8 + 3) = 0;
      local_7c8[4] = (void *)0x0;
      *(undefined4 *)(local_7c8 + 5) = 0;
      *(undefined4 *)((long)local_7c8 + 0x2c) = 0;
      *(undefined4 *)(local_7c8 + 6) = 0;
      *(undefined4 *)((long)local_7c8 + 0x34) = 0;
      *(undefined4 *)(local_7c8 + 7) = 0;
      local_7c8[8] = (void *)0x0;
      local_7c8 = local_7c8 + 9;
    } while (local_7c8 != &local_5b0);
    ppvVar7 = &local_5f8;
    local_338 = &local_4f8;
    local_330 = ppvVar7;
    if (ppvVar7 != local_338) {
      if (local_4f0 != (int *)0x0) {
        local_33c = 1;
        LOCK();
        local_340 = *local_4f0;
        *local_4f0 = *local_4f0 + 1;
        UNLOCK();
      }
      ppvVar9 = ppvVar7;
      local_2e0 = ppvVar7;
      if (local_5f0 != (int *)0x0) {
        local_2e4 = 0xffffffff;
        LOCK();
        local_2e8 = *local_5f0;
        *local_5f0 = *local_5f0 + -1;
        UNLOCK();
        if (local_2e8 == 1) {
          if (local_5d8 == (long *)0x0) {
            if (local_5f8 != (void *)0x0) {
              free(local_5f8);
            }
          }
          else {
            (**(code **)(*local_5d8 + 0x18))(local_5d8,local_5f8);
          }
        }
      }
      *ppvVar7 = (void *)0x0;
      ppvVar7[2] = (void *)0x0;
      *(undefined4 *)(ppvVar7 + 3) = 0;
      *(undefined4 *)(ppvVar7 + 5) = 0;
      *(undefined4 *)((long)ppvVar7 + 0x2c) = 0;
      *(undefined4 *)(ppvVar7 + 6) = 0;
      *(undefined4 *)((long)ppvVar7 + 0x34) = 0;
      *(undefined4 *)(ppvVar7 + 7) = 0;
      ppvVar7[8] = (void *)0x0;
      ppvVar7[1] = (void *)0x0;
      *ppvVar9 = *local_338;
      ppvVar9[1] = local_338[1];
      ppvVar9[2] = local_338[2];
      *(undefined4 *)(ppvVar9 + 3) = *(undefined4 *)(local_338 + 3);
      ppvVar9[4] = local_338[4];
      *(undefined4 *)(ppvVar9 + 5) = *(undefined4 *)(local_338 + 5);
      *(undefined4 *)((long)ppvVar9 + 0x2c) = *(undefined4 *)((long)local_338 + 0x2c);
      *(undefined4 *)(ppvVar9 + 6) = *(undefined4 *)(local_338 + 6);
      *(undefined4 *)((long)ppvVar9 + 0x34) = *(undefined4 *)((long)local_338 + 0x34);
      *(undefined4 *)(ppvVar9 + 7) = *(undefined4 *)(local_338 + 7);
      ppvVar9[8] = local_338[8];
      ppvVar7 = ppvVar9;
    }
    plVar8 = (long *)in_RDI[2];
    local_328 = ppvVar7;
    ModelBinFromMatArray::ModelBinFromMatArray
              ((ModelBinFromMatArray *)in_stack_fffffffffffff730,
               (Mat *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    (**(code **)(*plVar8 + 0x18))(plVar8,local_608);
    ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffff710);
    (**(code **)(*(long *)in_RDI[2] + 0x20))((long *)in_RDI[2],local_478);
    ppvVar7 = &local_5b0;
    do {
      ppvVar9 = ppvVar7 + -9;
      local_3a0 = ppvVar9;
      local_220 = ppvVar9;
      if (ppvVar7[-8] != (void *)0x0) {
        piVar1 = (int *)ppvVar7[-8];
        local_224 = 0xffffffff;
        LOCK();
        local_228 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_228 == 1) {
          if (ppvVar7[-5] == (void *)0x0) {
            local_68 = *ppvVar9;
            if (local_68 != (void *)0x0) {
              free(local_68);
            }
          }
          else {
            (**(code **)(*ppvVar7[-5] + 0x18))(ppvVar7[-5],*ppvVar9);
          }
        }
      }
      *ppvVar9 = (void *)0x0;
      ppvVar7[-7] = (void *)0x0;
      *(undefined4 *)(ppvVar7 + -6) = 0;
      *(undefined4 *)(ppvVar7 + -4) = 0;
      *(undefined4 *)((long)ppvVar7 + -0x1c) = 0;
      *(undefined4 *)(ppvVar7 + -3) = 0;
      *(undefined4 *)((long)ppvVar7 + -0x14) = 0;
      *(undefined4 *)(ppvVar7 + -2) = 0;
      ppvVar7[-1] = (void *)0x0;
      ppvVar7[-8] = (void *)0x0;
      ppvVar7 = ppvVar9;
    } while (ppvVar9 != &local_5f8);
    local_390 = &local_4f8;
    local_240 = local_390;
    if (local_4f0 != (int *)0x0) {
      local_244 = 0xffffffff;
      LOCK();
      local_248 = *local_4f0;
      *local_4f0 = *local_4f0 + -1;
      UNLOCK();
      if (local_248 == 1) {
        if (local_4d8 == (long *)0x0) {
          local_58 = local_4f8;
          if (local_4f8 != (void *)0x0) {
            free(local_4f8);
          }
        }
        else {
          (**(code **)(*local_4d8 + 0x18))(local_4d8,local_4f8);
        }
      }
    }
    local_4f8 = (void *)0x0;
    local_4e8 = 0;
    local_4e0 = 0;
    local_4d0 = 0;
    local_4cc = 0;
    local_4c8 = 0;
    local_4c4 = 0;
    local_4c0 = 0;
    local_4b8 = 0;
    local_4f0 = (int *)0x0;
    ParamDict::~ParamDict(in_stack_fffffffffffff710);
  }
  if ((*local_478 & 1) != 0) {
    lVar2 = *(long *)(*in_RDI + -0x18);
    puVar5 = (undefined8 *)((long)in_RDI + lVar2 + 0x160);
    if (*(long *)((long)in_RDI + lVar2 + 0x168) != 0) {
      piVar1 = *(int **)((long)in_RDI + lVar2 + 0x168);
      local_194 = 0xffffffff;
      LOCK();
      local_198 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_198 == 1) {
        local_190 = puVar5;
        if (*(long *)((long)in_RDI + lVar2 + 0x180) == 0) {
          local_b0 = (void *)*puVar5;
          if (local_b0 != (void *)0x0) {
            free(local_b0);
          }
        }
        else {
          plVar8 = *(long **)((long)in_RDI + lVar2 + 0x180);
          (**(code **)(*plVar8 + 0x18))(plVar8,*puVar5);
        }
      }
    }
    *puVar5 = 0;
    puVar5[2] = 0;
    *(undefined4 *)(puVar5 + 3) = 0;
    *(undefined4 *)(puVar5 + 5) = 0;
    *(undefined4 *)((long)puVar5 + 0x2c) = 0;
    *(undefined4 *)(puVar5 + 6) = 0;
    *(undefined4 *)((long)puVar5 + 0x34) = 0;
    *(undefined4 *)(puVar5 + 7) = 0;
    puVar5[8] = 0;
    puVar5[1] = 0;
  }
  return 0;
}

Assistant:

int Deconvolution_x86_avx::create_pipeline(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    const int maxk = kernel_w * kernel_h;
    int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 1);                 // transA
        pd.set(3, 0);                 // transB
        pd.set(4, 1);                 // constantA
        pd.set(5, 0);                 // constantB
        pd.set(6, 1);                 // constantC
        pd.set(7, maxk * num_output); // M = maxk*num_output
        pd.set(8, 0);                 // N = size
        pd.set(9, num_input);         // K = inch
        pd.set(10, -1);               // constant_broadcast_type_C = null
        pd.set(11, 0);                // output_N1M
        pd.set(12, out_elempack);

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-outch/pa-inch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_output, num_input);

            for (int p = 0; p < num_input; p += 1)
            {
                float* g00 = tmp.row(p);

                for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < out_elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q + i).row(p);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        ncnn::Mat weights[1];
        weights[0] = tmp;

        gemm->load_model(ModelBinFromMatArray(weights));

        gemm->create_pipeline(opt);
    }
    else
    {
        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < num_input * num_output; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

        // src = kw-kh-inch-outch
        // dst = pb-pa-kw-kh-inch/pa-outch/pb
        Mat weight_data_r2 = weight_data_transposed.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}